

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O2

bool console::readline(string *line,bool multiline_input)

{
  char cVar1;
  size_type sVar2;
  char *pcVar3;
  wchar_t __c;
  wint_t wVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  istream *piVar8;
  bool bVar9;
  long lVar10;
  pointer __ptr;
  char cVar11;
  size_type sVar12;
  size_t __size;
  bool bVar13;
  int local_64;
  int x2;
  int x1;
  vector<int,_std::allocator<int>_> widths;
  int y2;
  int y1;
  undefined1 local_38 [2];
  ushort local_36;
  
  set_display(user_input);
  cVar11 = (char)line;
  if (simple_io == '\x01') {
    piVar8 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&std::cin,(string *)line);
    if (((byte)piVar8[*(long *)(*(long *)piVar8 + -0x18) + 0x20] & 5) != 0) {
      line->_M_string_length = 0;
      *(line->_M_dataplus)._M_p = '\0';
      return false;
    }
    if (line->_M_string_length != 0) {
      cVar1 = (line->_M_dataplus)._M_p[line->_M_string_length - 1];
      if (cVar1 == '/') {
        std::__cxx11::string::pop_back();
        return false;
      }
      if (cVar1 == '\\') {
        std::__cxx11::string::pop_back();
        multiline_input = !multiline_input;
      }
    }
    std::__cxx11::string::push_back(cVar11);
    return multiline_input;
  }
  if (out != _stdout) {
    fflush(_stdout);
  }
  line->_M_string_length = 0;
  *(line->_M_dataplus)._M_p = '\0';
  widths.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  widths.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  widths.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  bVar9 = false;
  while( true ) {
    fflush(out);
    __c = getwchar();
    if (((uint)(__c + L'\x01') < 0xf) && ((0x4821U >> (__c + L'\x01' & 0x1fU) & 1) != 0)) break;
    if (bVar9) {
      set_display(user_input);
      replace_last((line->_M_dataplus)._M_p[line->_M_string_length - 1]);
      bVar9 = false;
    }
    if ((__c == L'\b') || (__c == L'\x7f')) {
      do {
        if (widths.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start ==
            widths.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish) break;
        iVar5 = widths.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                ._M_finish[-1];
        widths.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = widths.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + -1;
        iVar6 = 0;
        if (0 < iVar5) {
          iVar6 = iVar5;
        }
        while (bVar13 = iVar6 != 0, iVar6 = iVar6 + -1, bVar13) {
          replace_last(' ');
          pop_cursor();
        }
        if (line->_M_string_length != 0) {
          std::__cxx11::string::erase((ulong)line,line->_M_string_length - 1);
        }
      } while (iVar5 == 0);
    }
    else if (__c == L'\x1b') {
      wVar4 = getwchar();
      if ((wVar4 & 0xffffffbf) == 0x1b) {
        do {
          wVar4 = getwchar();
          if (((wVar4 == 0xffffffff) || (wVar4 - 0x41 < 0x1a)) || (wVar4 == 0x7e)) break;
        } while (0x19 < wVar4 - 0x61);
      }
    }
    else {
      sVar2 = line->_M_string_length;
      if ((uint)__c < 0x80) {
LAB_001c0236:
        std::__cxx11::string::push_back(cVar11);
        sVar12 = line->_M_string_length;
      }
      else {
        if ((uint)__c < 0x800) {
          std::__cxx11::string::push_back(cVar11);
          goto LAB_001c0236;
        }
        if ((uint)__c < 0x10000) {
          std::__cxx11::string::push_back(cVar11);
          std::__cxx11::string::push_back(cVar11);
          goto LAB_001c0236;
        }
        sVar12 = sVar2;
        if ((uint)__c < 0x110000) {
          std::__cxx11::string::push_back(cVar11);
          std::__cxx11::string::push_back(cVar11);
          std::__cxx11::string::push_back(cVar11);
          goto LAB_001c0236;
        }
      }
      lVar10 = (long)(int)sVar2;
      __size = sVar12 - lVar10;
      __ptr = (line->_M_dataplus)._M_p + lVar10;
      iVar5 = wcwidth(__c);
      if (tty == (FILE *)0x0 || -1 < iVar5) {
        fwrite(__ptr,__size,1,out);
      }
      else {
        fputs("\x1b[6n",tty);
        iVar6 = __isoc99_fscanf(tty,"\x1b[%d;%dR",&y1,&x1);
        fwrite(__ptr,__size,1,tty);
        fputs("\x1b[6n",tty);
        iVar7 = __isoc99_fscanf(tty,"\x1b[%d;%dR",&y2,&x2);
        if ((iVar7 + iVar6 == 4) && (iVar5 = x2 - x1, iVar5 < 0)) {
          ioctl(1,0x5413,local_38);
          iVar5 = iVar5 + (uint)local_36;
        }
      }
      if (iVar5 < 1) {
        iVar5 = 0;
      }
      local_64 = iVar5;
      std::vector<int,_std::allocator<int>_>::push_back(&widths,&local_64);
    }
    if ((line->_M_string_length != 0) &&
       ((cVar1 = (line->_M_dataplus)._M_p[line->_M_string_length - 1], cVar1 == '\\' ||
        (cVar1 == '/')))) {
      set_display(prompt);
      replace_last((line->_M_dataplus)._M_p[line->_M_string_length - 1]);
      bVar9 = true;
    }
  }
  if (bVar9) {
    replace_last(' ');
    pop_cursor();
    cVar1 = (line->_M_dataplus)._M_p[line->_M_string_length - 1];
    std::__cxx11::string::pop_back();
    if (cVar1 == '\\') {
      std::__cxx11::string::push_back(cVar11);
      fputc(10,out);
      multiline_input = !multiline_input;
      goto LAB_001c0464;
    }
    if ((line->_M_string_length == 1) && (pcVar3 = (line->_M_dataplus)._M_p, *pcVar3 == ' ')) {
      line->_M_string_length = 0;
      *pcVar3 = '\0';
      pop_cursor();
    }
  }
  else if ((__c == L'\r') || (__c == L'\n')) {
    std::__cxx11::string::push_back(cVar11);
    fputc(10,out);
    goto LAB_001c0464;
  }
  multiline_input = false;
LAB_001c0464:
  fflush(out);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&widths.super__Vector_base<int,_std::allocator<int>_>);
  return multiline_input;
}

Assistant:

bool readline(std::string & line, bool multiline_input) {
        set_display(user_input);

        if (simple_io) {
            return readline_simple(line, multiline_input);
        }
        return readline_advanced(line, multiline_input);
    }